

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_commit_read(ma_rb *pRB,size_t sizeInBytes)

{
  ma_uint32 newReadOffsetLoopFlag;
  ma_uint32 newReadOffsetInBytes;
  ma_uint32 readOffsetLoopFlag;
  ma_uint32 readOffsetInBytes;
  ma_uint32 readOffset;
  size_t sizeInBytes_local;
  ma_rb *pRB_local;
  ma_result local_2c;
  
  if (pRB == (ma_rb *)0x0) {
    local_2c = MA_INVALID_ARGS;
  }
  else {
    newReadOffsetLoopFlag = pRB->encodedReadOffset & 0x80000000;
    newReadOffsetInBytes = (pRB->encodedReadOffset & 0x7fffffff) + (int)sizeInBytes;
    if (pRB->subbufferSizeInBytes < newReadOffsetInBytes) {
      local_2c = MA_INVALID_ARGS;
    }
    else {
      if (newReadOffsetInBytes == pRB->subbufferSizeInBytes) {
        newReadOffsetInBytes = 0;
        newReadOffsetLoopFlag = newReadOffsetLoopFlag ^ 0x80000000;
      }
      LOCK();
      pRB->encodedReadOffset = newReadOffsetLoopFlag | newReadOffsetInBytes;
      UNLOCK();
      local_2c = MA_SUCCESS;
    }
  }
  return local_2c;
}

Assistant:

MA_API ma_result ma_rb_commit_read(ma_rb* pRB, size_t sizeInBytes)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 newReadOffsetInBytes;
    ma_uint32 newReadOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    /* Check that sizeInBytes is correct. It should never go beyond the end of the buffer. */
    newReadOffsetInBytes = (ma_uint32)(readOffsetInBytes + sizeInBytes);
    if (newReadOffsetInBytes > pRB->subbufferSizeInBytes) {
        return MA_INVALID_ARGS;    /* <-- sizeInBytes will cause the read offset to overflow. */
    }

    /* Move the read pointer back to the start if necessary. */
    newReadOffsetLoopFlag = readOffsetLoopFlag;
    if (newReadOffsetInBytes == pRB->subbufferSizeInBytes) {
        newReadOffsetInBytes = 0;
        newReadOffsetLoopFlag ^= 0x80000000;
    }

    ma_atomic_exchange_32(&pRB->encodedReadOffset, ma_rb__construct_offset(newReadOffsetInBytes, newReadOffsetLoopFlag));

    return MA_SUCCESS;
}